

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void estimateIndexWidth(Index *pIdx)

{
  LogEst LVar1;
  ulong uVar2;
  uint uVar3;
  ulong x;
  
  x = 0;
  if ((ulong)pIdx->nColumn != 0) {
    uVar2 = 0;
    do {
      if ((long)pIdx->aiColumn[uVar2] < 0) {
        uVar3 = 1;
      }
      else {
        uVar3 = (uint)pIdx->pTable->aCol[pIdx->aiColumn[uVar2]].szEst;
      }
      uVar3 = (int)x + uVar3;
      x = (ulong)uVar3;
      uVar2 = uVar2 + 1;
    } while (pIdx->nColumn != uVar2);
    x = (ulong)(uVar3 * 4);
  }
  LVar1 = sqlite3LogEst(x);
  pIdx->szIdxRow = LVar1;
  return;
}

Assistant:

static void estimateIndexWidth(Index *pIdx){
  unsigned wIndex = 0;
  int i;
  const Column *aCol = pIdx->pTable->aCol;
  for(i=0; i<pIdx->nColumn; i++){
    i16 x = pIdx->aiColumn[i];
    assert( x<pIdx->pTable->nCol );
    wIndex += x<0 ? 1 : aCol[x].szEst;
  }
  pIdx->szIdxRow = sqlite3LogEst(wIndex*4);
}